

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall MD5::final(MD5 *this)

{
  ulong uVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  byte bits [8];
  ulong oldState [4];
  byte local_40 [8];
  ulong local_38;
  ulong uStack_30;
  
  local_38 = this->_state[0];
  uStack_30 = this->_state[1];
  uVar1 = this->_count[0];
  lVar3 = 0;
  do {
    *(int *)(local_40 + lVar3 * 4) = (int)this->_count[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  uVar2 = (uint)(uVar1 >> 3) & 0x3f;
  update(this,PADDING,((ulong)(0x37 < uVar2) << 6 | 0x38) - (ulong)uVar2);
  update(this,local_40,8);
  lVar3 = 0;
  do {
    this->_digest[lVar3 * 4] = (byte)this->_state[lVar3];
    this->_digest[lVar3 * 4 + 1] = *(byte *)((long)this->_state + lVar3 * 8 + 1);
    this->_digest[lVar3 * 4 + 2] = *(byte *)((long)this->_state + lVar3 * 8 + 2);
    this->_digest[lVar3 * 4 + 3] = *(byte *)((long)this->_state + lVar3 * 8 + 3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  this->_state[0] = local_38;
  this->_state[1] = uStack_30;
  this->_count[0] = uVar1;
  return;
}

Assistant:

void MD5::final()
{

    byte bits[8];
    ulong oldState[4];
    ulong oldCount[2];
    ulong index, padLen;

    /* Save current state and count. */
    memcpy(oldState, _state, 16);
    memcpy(oldCount, _count, 8);

    /* Save number of bits */
    encode(_count, bits, 8);

    /* Pad out to 56 mod 64. */
    index = (ulong) ((_count[0] >> 3) & 0x3f);
    padLen = (index < 56) ? (56 - index) : (120 - index);
    update(PADDING, padLen);

    /* Append length (before padding) */
    update(bits, 8);

    /* Store state in digest */
    encode(_state, _digest, 16);

    /* Restore current state and count. */
    memcpy(_state, oldState, 16);
    memcpy(_count, oldCount, 8);
}